

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vgetexpps_(PDISASM pMyDisasm)

{
  char *pcVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
      builtin_strncpy(pcVar1,"vgetexpps",10);
    }
    else {
      builtin_strncpy(pcVar1,"vgetexppd",10);
    }
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    vex_GxEx(pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ vgetexpps_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgetexpps");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgetexppd");
        #endif
      }
      GV.EVEX.tupletype = FULL;
      vex_GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}